

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::CreateGeneratorTargets
          (cmGlobalGenerator *this,TargetTypes targetTypes,cmMakefile *mf,cmLocalGenerator *lg,
          map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
          *importedMap)

{
  pointer ppcVar1;
  const_iterator cVar2;
  cmTarget *pcVar3;
  pointer ppcVar4;
  cmTarget *t;
  cmTarget *target;
  _Head_base<0UL,_cmTargetInternals_*,_false> local_58;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> local_50;
  _Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_> local_48;
  
  if (targetTypes == AllTargets) {
    ppcVar1 = (mf->OrderedTargets).super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar4 = (mf->OrderedTargets).super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppcVar4 != ppcVar1;
        ppcVar4 = ppcVar4 + 1) {
      local_48._M_impl.super__Vector_impl_data._M_start = (pointer)*ppcVar4;
      std::make_unique<cmGeneratorTarget,cmTarget*&,cmLocalGenerator*&>
                ((cmTarget **)&local_50,(cmLocalGenerator **)&local_48);
      cmLocalGenerator::AddGeneratorTarget(lg,&local_50);
      std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
                (&local_50);
    }
  }
  cmMakefile::GetImportedTargets((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)&local_48,mf);
  for (pcVar3 = (cmTarget *)local_48._M_impl.super__Vector_impl_data._M_start;
      pcVar3 != (cmTarget *)local_48._M_impl.super__Vector_impl_data._M_finish; pcVar3 = pcVar3 + 1)
  {
    local_58._M_head_impl =
         (pcVar3->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    cVar2 = std::
            _Rb_tree<cmTarget_*,_std::pair<cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
            ::find(&importedMap->_M_t,(key_type *)&local_58);
    cmLocalGenerator::AddImportedGeneratorTarget(lg,(cmGeneratorTarget *)cVar2._M_node[1]._M_parent)
    ;
  }
  std::_Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void cmGlobalGenerator::CreateGeneratorTargets(
  TargetTypes targetTypes, cmMakefile* mf, cmLocalGenerator* lg,
  std::map<cmTarget*, cmGeneratorTarget*> const& importedMap)
{
  if (targetTypes == AllTargets) {
    for (cmTarget* target : mf->GetOrderedTargets()) {
      lg->AddGeneratorTarget(cm::make_unique<cmGeneratorTarget>(target, lg));
    }
  }

  for (cmTarget* t : mf->GetImportedTargets()) {
    lg->AddImportedGeneratorTarget(importedMap.find(t)->second);
  }
}